

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_compile(unqlite *pDb,char *zJx9,int nByte,unqlite_vm **ppOut)

{
  jx9 *pEngine;
  char *pcVar1;
  sxi32 sVar2;
  int iVar3;
  char *pcVar4;
  char *in_R8;
  jx9_vm *pVm;
  jx9_vm *local_28;
  SyString local_20;
  
  sVar2 = -0x18;
  if ((((pDb != (unqlite *)0x0) && (ppOut != (unqlite_vm **)0x0)) && (pDb->nMagic == 0xdb7c2712)) &&
     ((pEngine = (pDb->sDB).pJx9, pEngine != (jx9 *)0x0 && (pEngine->nMagic == 0xf874bcd7)))) {
    if (zJx9 == (char *)0x0) {
      nByte = 1;
    }
    local_20.zString = ";";
    if (zJx9 != (char *)0x0) {
      local_20.zString = zJx9;
    }
    if (nByte < 0) {
      pcVar4 = local_20.zString;
      if (*local_20.zString != '\0') {
        pcVar1 = local_20.zString + 2;
        do {
          pcVar4 = pcVar1;
          if (pcVar4[-1] == '\0') {
            pcVar4 = pcVar4 + -1;
            goto LAB_0010ba13;
          }
          if (*pcVar4 == '\0') goto LAB_0010ba13;
          if (pcVar4[1] == '\0') {
            pcVar4 = pcVar4 + 1;
            goto LAB_0010ba13;
          }
          pcVar1 = pcVar4 + 4;
        } while (pcVar4[2] != '\0');
        pcVar4 = pcVar4 + 2;
      }
LAB_0010ba13:
      nByte = (int)pcVar4 - (int)local_20.zString;
    }
    local_20.nByte = nByte;
    sVar2 = ProcessScript(pEngine,&local_28,&local_20,0,in_R8);
    if (sVar2 == 0) {
      iVar3 = unqliteInitVm(pDb,local_28,ppOut);
      sVar2 = 0;
      if (iVar3 != 0) {
        jx9_vm_release(local_28);
        sVar2 = -1;
      }
    }
  }
  return sVar2;
}

Assistant:

int unqlite_compile(unqlite *pDb,const char *zJx9,int nByte,unqlite_vm **ppOut)
{
	jx9_vm *pVm;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) || ppOut == 0){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT;
	 }
#endif
	 /* Compile the Jx9 script first */
	 rc = jx9_compile(pDb->sDB.pJx9,zJx9,nByte,&pVm);
	 if( rc == JX9_OK ){
		 /* Allocate a new unqlite VM instance */
		 rc = unqliteInitVm(pDb,pVm,ppOut);
		 if( rc != UNQLITE_OK ){
			 /* Release the Jx9 VM */
			 jx9_vm_release(pVm);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}